

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

void Am_Set_Timer_State(Am_Timer_State new_state)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Value *this;
  Am_Time local_60;
  Am_Time local_58;
  undefined1 local_50 [8];
  Am_Value_List events;
  Am_Interactor_Time_Event *next_event;
  Am_Time diff;
  Am_Time local_20;
  Am_Time after;
  Am_Time before;
  Am_Timer_State new_state_local;
  
  am_clock();
  Am_Global_Timer_State = new_state;
  am_clock();
  pAVar2 = Am_Time::operator_cast_to_Am_Wrapper_(&after);
  pAVar3 = Am_Time::operator_cast_to_Am_Wrapper_(&local_20);
  if (pAVar2 != pAVar3) {
    Am_Time::operator-((Am_Time *)&next_event,&local_20);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_50,&am_timing_events);
    Am_Value_List::Start((Am_Value_List *)local_50);
    while( true ) {
      bVar1 = Am_Value_List::Last((Am_Value_List *)local_50);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      this = Am_Value_List::Get((Am_Value_List *)local_50);
      events.item = (Am_List_Item *)Am_Value::operator_cast_to_void_(this);
      Am_Time::operator+(&local_58,(Am_Time *)&(events.item)->next);
      Am_Time::operator=((Am_Time *)&(events.item)->next,&local_58);
      Am_Time::~Am_Time(&local_58);
      Am_Time::operator+(&local_60,(Am_Time *)(events.item + 1));
      Am_Time::operator=((Am_Time *)(events.item + 1),&local_60);
      Am_Time::~Am_Time(&local_60);
      Am_Value_List::Next((Am_Value_List *)local_50);
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
    Am_Time::~Am_Time((Am_Time *)&next_event);
  }
  Am_Time::~Am_Time(&local_20);
  Am_Time::~Am_Time(&after);
  return;
}

Assistant:

void
Am_Set_Timer_State(Am_Timer_State new_state)
{
  Am_Time before = am_clock();
  Am_Global_Timer_State = new_state;
  Am_Time after = am_clock();

  if (before != after) {
    // a discontinuity in the clock (caused by suspending and then resuming);
    // translate every timestamp on the queue to the new timeline
    Am_Time diff = after - before;

    Am_Interactor_Time_Event *next_event;
    Am_Value_List events = am_timing_events;
    for (events.Start(); !events.Last(); events.Next()) {
      next_event = (Am_Interactor_Time_Event *)(Am_Ptr)events.Get();
      next_event->next_timeout = next_event->next_timeout + diff;
      next_event->start_time = next_event->start_time + diff;
    }
  }
}